

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileOptions::FileOptions(FileOptions *this,Arena *arena,bool is_message_owned)

{
  bool is_message_owned_local;
  Arena *arena_local;
  FileOptions *this_local;
  
  Message::Message(&this->super_Message,arena,is_message_owned);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileOptions_008eaf98;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_,arena);
  internal::HasBits<1UL>::HasBits(&this->_has_bits_);
  internal::CachedSize::CachedSize(&this->_cached_size_);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::RepeatedPtrField
            (&this->uninterpreted_option_,arena);
  SharedCtor(this);
  if (!is_message_owned) {
    RegisterArenaDtor(this,arena);
  }
  return;
}

Assistant:

FileOptions::FileOptions(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::Message(arena, is_message_owned),
  _extensions_(arena),
  uninterpreted_option_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:google.protobuf.FileOptions)
}